

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * create_sampler_address_abi_cxx11_
                   (string *__return_storage_ptr__,char *prefix,MSLSamplerAddress addr)

{
  CompilerError *this;
  char *pcVar1;
  char *local_18;
  
  local_18 = prefix;
  switch(addr) {
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
    pcVar1 = "address::clamp_to_zero";
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
    pcVar1 = "address::clamp_to_edge";
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
    pcVar1 = "address::clamp_to_border";
    goto LAB_0021938a;
  case MSL_SAMPLER_ADDRESS_REPEAT:
    spirv_cross::join<char_const*&,char_const(&)[16]>
              (__return_storage_ptr__,(spirv_cross *)&local_18,(char **)"address::repeat",
               (char (*) [16])&switchD_0021936f::switchdataD_003945d4);
    return __return_storage_ptr__;
  case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
    pcVar1 = "address::mirrored_repeat";
LAB_0021938a:
    spirv_cross::join<char_const*&,char_const(&)[25]>
              (__return_storage_ptr__,(spirv_cross *)&local_18,(char **)pcVar1,
               (char (*) [25])&switchD_0021936f::switchdataD_003945d4);
    return __return_storage_ptr__;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid sampler addressing mode.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  spirv_cross::join<char_const*&,char_const(&)[23]>
            (__return_storage_ptr__,(spirv_cross *)&local_18,(char **)pcVar1,
             (char (*) [23])&switchD_0021936f::switchdataD_003945d4);
  return __return_storage_ptr__;
}

Assistant:

static string create_sampler_address(const char *prefix, MSLSamplerAddress addr)
{
	switch (addr)
	{
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
		return join(prefix, "address::clamp_to_edge");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
		return join(prefix, "address::clamp_to_zero");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
		return join(prefix, "address::clamp_to_border");
	case MSL_SAMPLER_ADDRESS_REPEAT:
		return join(prefix, "address::repeat");
	case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
		return join(prefix, "address::mirrored_repeat");
	default:
		SPIRV_CROSS_THROW("Invalid sampler addressing mode.");
	}
}